

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

bool __thiscall Moves::TryAttack(Moves *this,Move *m,Board *board,int id,int jd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  uint uVar5;
  value_type local_58;
  Square local_30;
  
  local_58.m_Piece._0_4_ = *(undefined4 *)&m->m_Piece;
  local_58.m_Piece._4_4_ = *(undefined4 *)((long)&m->m_Piece + 4);
  local_58.m_Source.i = (m->m_Source).i;
  local_58.m_Source.j = (m->m_Source).j;
  local_58.m_Score = m->m_Score;
  local_58._28_4_ = *(undefined4 *)&m->field_0x1c;
  local_58.m_PromoteTo = m->m_PromoteTo;
  uVar5 = id + local_58.m_Source.i;
  uVar4 = local_58.m_Source.j + jd;
  local_58.m_Dest.j = uVar4;
  local_58.m_Dest.i = uVar5;
  if (uVar4 < 8 && uVar5 < 8) {
    local_30 = local_58.m_Dest;
    iVar2 = (*m->m_Piece->_vptr_Piece[4])(m->m_Piece,&local_30,board);
    iVar3 = (*(board->super_BoardPieceSquare).super_BoardHashing.super_BoardBase._vptr_BoardBase[1])
                      (board,(ulong)(uVar5 + uVar4 * 8));
    if ((char)iVar2 == '\0') {
      local_58.m_Score = 0;
      if ((NoPiece *)CONCAT44(extraout_var,iVar3) != &None) {
        return false;
      }
    }
    else {
      local_58.m_Score = (**(((NoPiece *)CONCAT44(extraout_var,iVar3))->super_Piece)._vptr_Piece)();
    }
    std::vector<Move,_std::allocator<Move>_>::push_back(&this->m_Moves,&local_58);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TryAttack( const Move &m, const Board &board, int id, int jd )
    {
        Move myMove = m;

        myMove.Dest( Square( id + myMove.Source().I(), jd + myMove.Source().J() ) );

        if ( myMove.Dest().IsOnBoard() )
        {
            // Captures are more interesting than moves.
            if ( myMove.GetPiece()->IsDifferent( myMove.Dest(), board ) )
            {
                myMove.Score( board.Get( myMove.Dest() )->PieceValue() );
                Add( myMove );
                return true;
            }
            else if ( board.IsEmpty( myMove.Dest() ) )
            {
                myMove.Score( None.PieceValue() );
                Add( myMove );
                return true;
            }
        }

        return false;
    }